

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

bool __thiscall
google::protobuf::TextFormat::Parser::ParseFromCord(Parser *this,Cord *input,Message *output)

{
  Nullable<absl::cord_internal::CordRep_*> buffer;
  char cVar1;
  ErrorCollector *pEVar2;
  bool bVar3;
  Nonnull<char_*> pcVar4;
  ulong i;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces;
  CordInputStream input_stream;
  string local_160;
  CordRepBtree *local_140;
  CordRepBtree *local_138;
  undefined1 local_130 [80];
  undefined1 local_e0 [64];
  CordRepBtree *local_a0;
  CordRepBtree *local_98;
  CordRepBtree *local_90;
  char *local_88;
  
  pEVar2 = this->error_collector_;
  cVar1 = (input->contents_).data_.rep_.field_0.data[0];
  if (((long)cVar1 & 1U) == 0) {
    if (-1 < cVar1) {
LAB_00470095:
      io::CordInputStream::CordInputStream((CordInputStream *)local_e0,input);
      bVar3 = Parse(this,(ZeroCopyInputStream *)local_e0,output);
      return bVar3;
    }
    i = (ulong)(long)cVar1 >> 1;
  }
  else {
    i = ((input->contents_).data_.rep_.field_0.as_tree.rep)->length;
    if ((i & 0xffffffff80000000) == 0) goto LAB_00470095;
  }
  buffer = (Nullable<absl::cord_internal::CordRep_*>)(local_130 + 0x30);
  pcVar4 = absl::lts_20250127::numbers_internal::FastIntToBuffer(i,(Nonnull<char_*>)buffer);
  local_130._32_8_ = pcVar4 + -(long)buffer;
  local_130._40_8_ = buffer;
  pcVar4 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                     (0x7fffffff,(Nonnull<char_*>)local_130);
  local_140 = (CordRepBtree *)(pcVar4 + -(long)local_130);
  local_e0._0_8_ = (_func_int **)0x16;
  local_e0._8_8_ = "Input size too large: ";
  local_e0._16_8_ = local_130._32_8_;
  local_e0._24_8_ = local_130._40_8_;
  local_e0._32_8_ = 6;
  local_e0._40_8_ = " bytes";
  local_e0._48_4_ = 3;
  local_e0[0x34] = '\0';
  local_e0[0x35] = '\0';
  local_e0[0x36] = '\0';
  local_e0[0x37] = '\0';
  local_e0._56_8_ = " > ";
  local_90 = (CordRepBtree *)0x7;
  local_88 = " bytes.";
  pieces._M_len = (size_type)" > ";
  pieces._M_array = (iterator)&DAT_00000006;
  local_138 = (CordRepBtree *)local_130;
  local_a0 = local_140;
  local_98 = (CordRepBtree *)local_130;
  absl::lts_20250127::strings_internal::CatPieces_abi_cxx11_
            (&local_160,(strings_internal *)local_e0,pieces);
  (*pEVar2->_vptr_ErrorCollector[2])
            (pEVar2,0xffffffff,0,local_160._M_string_length,local_160._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

bool TextFormat::Parser::ParseFromCord(const absl::Cord& input,
                                       Message* output) {
  DO(CheckParseInputSize(input, error_collector_));
  io::CordInputStream input_stream(&input);
  return Parse(&input_stream, output);
}